

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

_Bool target_okay(void)

{
  _Bool _Var1;
  monster_conflict *m;
  monster *mon;
  
  if (target_set) {
    if (target.midx < 1) {
      if ((target.grid.x != 0) && (target.grid.y != 0)) {
        return true;
      }
    }
    else {
      m = cave_monster(cave,target.midx);
      _Var1 = target_able((monster *)m);
      if (_Var1) {
        target.grid = m->grid;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool target_okay(void)
{
	/* No target */
	if (!target_set) return false;

	/* Check "monster" targets */
	if (target.midx > 0) {
		struct monster *mon = cave_monster(cave, target.midx);
		if (target_able(mon)) {
			/* Get the monster location */
			target.grid = mon->grid;

			/* Good target */
			return true;
		}
	} else if (target.grid.x && target.grid.y) {
		/* Allow a direction without a monster */
		return true;
	}

	/* Assume no target */
	return false;
}